

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O2

void Parser::
     MapBindIdentifierFromElement<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
               (ParseNodePtr elementNode,anon_class_32_4_343c1aa9 handler)

{
  code *pcVar1;
  OpCode OVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  
  OVar2 = elementNode->nop;
  if (OVar2 == knopEllipsis) {
    pPVar4 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
  }
  else {
    if (OVar2 != knopAsg) goto LAB_00782942;
    pPVar4 = ParseNode::AsParseNodeBin(elementNode);
  }
  elementNode = pPVar4->pnode1;
  OVar2 = elementNode->nop;
LAB_00782942:
  if ((OVar2 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
              (elementNode,handler);
    return;
  }
  if ((byte)(OVar2 + ~knopList) < 3) {
    AddArgsToScope::anon_class_32_4_343c1aa9::operator()(&handler,elementNode);
  }
  else if (OVar2 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }